

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O2

event_process_result
afsm::actions::detail::
inner_dispatch_table<std::tuple<afsm::state<afsm::test::b::inner_dispatch_test::state_b,_afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>_>,_afsm::state<afsm::test::b::inner_dispatch_test::state_c,_afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>_>,_afsm::state<afsm::test::b::inner_dispatch_test::state_a,_afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>_>_>_>
::process_event<afsm::test::b::event_ab>(states_tuple *states,size_t current_state,event_ab *event)

{
  event_process_result eVar1;
  invocation_table<afsm::test::b::event_ab> *piVar2;
  logic_error *this;
  indexes_tuple<0UL,_1UL,_2UL> local_79;
  invocation_table<afsm::test::b::event_ab> inv_table;
  
  if (current_state < 3) {
    piVar2 = inner_dispatch_table<std::tuple<afsm::state<afsm::test::b::inner_dispatch_test::state_b,afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,afsm::test::b::dummy_sm>>,afsm::state<afsm::test::b::inner_dispatch_test::state_c,afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,afsm::test::b::dummy_sm>>,afsm::state<afsm::test::b::inner_dispatch_test::state_a,afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,afsm::test::b::dummy_sm>>>>
             ::state_table<afsm::test::b::event_ab,0ul,1ul,2ul>(&local_79);
    std::
    array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::b::inner_dispatch_test::state_b,_afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>_>,_afsm::state<afsm::test::b::inner_dispatch_test::state_c,_afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>_>,_afsm::state<afsm::test::b::inner_dispatch_test::state_a,_afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>_>_>_&,_afsm::test::b::event_ab_&&)>,_3UL>
    ::array(&inv_table,piVar2);
    eVar1 = std::
            function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::b::inner_dispatch_test::state_b,_afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>_>,_afsm::state<afsm::test::b::inner_dispatch_test::state_c,_afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>_>,_afsm::state<afsm::test::b::inner_dispatch_test::state_a,_afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>_>_>_&,_afsm::test::b::event_ab_&&)>
            ::operator()(inv_table._M_elems + current_state,states,event);
    std::
    array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::b::inner_dispatch_test::state_b,_afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>_>,_afsm::state<afsm::test::b::inner_dispatch_test::state_c,_afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>_>,_afsm::state<afsm::test::b::inner_dispatch_test::state_a,_afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>_>_>_&,_afsm::test::b::event_ab_&&)>,_3UL>
    ::~array(&inv_table);
    return eVar1;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"Invalid current state index");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static event_process_result
    process_event(states_tuple& states, ::std::size_t current_state, Event&& event)
    {
        //using event_type = typename ::std::decay<Event>::type;
        if (current_state >= size)
            throw ::std::logic_error{ "Invalid current state index" };
        auto inv_table = state_table< Event >(indexes_tuple{});
        return inv_table[current_state](states, ::std::forward<Event>(event));
    }